

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O2

Action __thiscall
psy::C::TypeCanonicalizer::visitTranslationUnit(TypeCanonicalizer *this,TranslationUnitSyntax *node)

{
  Action AVar1;
  Action AVar2;
  TranslationUnitSymbol *local_20;
  
  local_20 = SemanticModel::translationUnit(this->semaModel_);
  std::deque<psy::C::Symbol_const*,std::allocator<psy::C::Symbol_const*>>::
  emplace_back<psy::C::Symbol_const*>
            ((deque<psy::C::Symbol_const*,std::allocator<psy::C::Symbol_const*>> *)&this->syms_,
             (Symbol **)&local_20);
  AVar1 = SyntaxVisitor::
          visit<psy::C::DeclarationSyntax*,psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax*>>
                    (&this->super_SyntaxVisitor,
                     &node->decls_->
                      super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                    );
  AVar2 = Quit;
  if (AVar1 != Quit) {
    std::deque<const_psy::C::Symbol_*,_std::allocator<const_psy::C::Symbol_*>_>::pop_back
              (&(this->syms_).c);
    AVar2 = Skip;
  }
  return AVar2;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitTranslationUnit(const TranslationUnitSyntax* node)
{
    syms_.push(semaModel_->translationUnit());
    VISIT(node->declarations());
    syms_.pop();

    return Action::Skip;
}